

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  byte *pbVar1;
  size_t sVar2;
  long lVar3;
  int *piVar4;
  uint *puVar5;
  cmsghdr *pcVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uv_stream_t *stream;
  ulong uVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  uint uVar14;
  undefined8 unaff_R14;
  undefined8 uStack_1d0;
  uv_buf_t local_1c8;
  uint local_1b4;
  uint *local_1b0;
  cmsghdr *local_1a8;
  uint local_1a0;
  int local_19c;
  uv_stream_t *local_198;
  ulong local_190;
  size_t local_188;
  msghdr msg;
  int error;
  undefined4 uStack_144;
  size_t sStack_140;
  
  uVar11 = w[-3].fd;
  if ((0xe < uVar11) || ((0x5080U >> (uVar11 & 0x1f) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x4ea,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((*(uint *)w[-1].pending_queue & 1) != 0) {
    __assert_fail("!(stream->flags & UV_HANDLE_CLOSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x4eb,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)(w[-3].watcher_queue + 1);
  lVar3 = *(long *)&w[-1].pevents;
  if (lVar3 != 0) {
    msg.msg_name = (void *)CONCAT44(msg.msg_name._4_4_,4);
    if ((uVar11 != 7) && (uVar11 != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x521,"void uv__stream_connect(uv_stream_t *)");
    }
    uVar11 = w[1].pevents;
    if (uVar11 == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x52d,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,&error,(socklen_t *)&msg);
      uVar11 = -error;
      _error = (char *)CONCAT44(uStack_144,uVar11);
    }
    else {
      _error = (char *)CONCAT44(uStack_144,uVar11);
      w[1].pevents = 0;
    }
    if (uVar11 == 0xffffff8d) {
      return;
    }
    w[-1].pevents = 0;
    w[-1].events = 0;
    iVar8 = *(int *)(*(long *)&w[-3].pevents + 0x20);
    if (iVar8 == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x53a,"void uv__stream_connect(uv_stream_t *)");
    }
    *(int *)(*(long *)&w[-3].pevents + 0x20) = iVar8 + -1;
    if (((int)uVar11 < 0) || (w + 1 == (uv__io_t *)w[1].cb)) {
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
      uVar11 = error;
    }
    if (*(code **)(lVar3 + 0x40) != (code *)0x0) {
      (**(code **)(lVar3 + 0x40))(lVar3);
      uVar11 = error;
    }
    if (w->fd == -1) {
      return;
    }
    if (-1 < (int)uVar11) {
      return;
    }
    uv__stream_flush_write_queue(stream,-0x7d);
    uv__write_callbacks(stream);
    return;
  }
  iVar8 = w->fd;
  if (iVar8 < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x4f2,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((events & 0x19) == 0) goto LAB_005f7d4e;
  *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffbfe;
  if (uVar11 == 7) {
    uVar13 = CONCAT71((int7)((ulong)unaff_R14 >> 8),*(int *)&w[2].cb != 0);
  }
  else {
    uVar13 = 0;
  }
  local_1b0 = &w[1].events;
  iVar8 = 0x20;
  do {
    if (((w[-1].watcher_queue[1] == (void *)0x0) || (((ulong)w[-1].pending_queue[0] & 0x1000) == 0))
       || (iVar8 == 0)) goto LAB_005f7d45;
    if (w[-1].watcher_queue[0] == (void *)0x0) {
      __assert_fail("stream->alloc_cb != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x44e,"void uv__read(uv_stream_t *)");
    }
    local_1c8 = uv_buf_init((char *)0x0,0);
    (*(code *)w[-1].watcher_queue[0])(stream,0x10000,&local_1c8);
    if ((local_1c8.base == (char *)0x0) || (local_1c8.len == 0)) {
      uStack_1d0 = 0xffffffffffffff97;
      goto LAB_005f7ca7;
    }
    if (w->fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x459,"void uv__read(uv_stream_t *)");
    }
    local_19c = iVar8 + -1;
    if ((char)uVar13 == '\0') {
      while( true ) {
        lVar3 = read(w->fd,local_1c8.base,local_1c8.len);
        if (-1 < lVar3) break;
        piVar4 = __errno_location();
        iVar8 = *piVar4;
        if (iVar8 != 4) goto LAB_005f7c81;
      }
    }
    else {
      msg.msg_flags = 0;
      msg.msg_iovlen = 1;
      msg.msg_name = (void *)0x0;
      msg.msg_namelen = 0;
      msg.msg_controllen = 0x110;
      msg.msg_control = &error;
      msg.msg_iov = (iovec *)&local_1c8;
      while (lVar3 = uv__recvmsg(w->fd,&msg,0), lVar3 < 0) {
        piVar4 = __errno_location();
        iVar8 = *piVar4;
        if (iVar8 != 4) goto LAB_005f7c81;
      }
    }
    if (lVar3 == 0) {
      uv__stream_eof(stream,&local_1c8);
      goto LAB_005f7d45;
    }
    local_188 = local_1c8.len;
    if ((char)uVar13 != '\0') {
      pcVar6 = (cmsghdr *)msg.msg_control;
      if (msg.msg_controllen < 0x10) {
        pcVar6 = (cmsghdr *)0x0;
      }
      local_1a0 = (uint)uVar13;
      local_1b4 = events;
      local_198 = stream;
      while (stream = local_198, events = local_1b4, pcVar6 != (cmsghdr *)0x0) {
        if (pcVar6->cmsg_type == 1) {
          uVar13 = 0xffffffff;
          uVar11 = 0;
          do {
            uVar9 = uVar11;
            uVar14 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar14;
            sVar2 = uVar13 * 4 + 0x10;
            uVar11 = uVar9 + 1;
          } while ((long)sVar2 < (long)pcVar6->cmsg_len);
          local_1a8 = pcVar6;
          if (sVar2 != pcVar6->cmsg_len) {
            __assert_fail("start + CMSG_LEN(count * sizeof(*pi)) == end",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x41a,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
          }
          uVar13 = (ulong)uVar9;
          uVar10 = 0;
          puVar5 = local_1b0;
          local_190 = uVar13;
LAB_005f7b6b:
          if (uVar13 != uVar10) {
            uVar11 = *(uint *)((long)&pcVar6[1].cmsg_len + uVar10 * 4);
            puVar12 = puVar5;
            if (*puVar5 == 0xffffffff) goto LAB_005f7c11;
            puVar5 = *(uint **)&w[1].fd;
            if (puVar5 != (uint *)0x0) {
              uVar9 = *puVar5;
              uVar7 = puVar5[1];
              if (uVar9 == uVar7) {
                puVar5 = (uint *)uv__realloc(puVar5,(ulong)(uVar9 + 7) * 4 + 0xc);
                if (puVar5 == (uint *)0x0) goto LAB_005f7d0a;
                *puVar5 = uVar9 + 8;
                *(uint **)&w[1].fd = puVar5;
                uVar7 = puVar5[1];
                puVar12 = local_1b0;
                uVar13 = local_190;
              }
LAB_005f7bfc:
              puVar5[1] = uVar7 + 1;
              puVar5 = puVar5 + (ulong)uVar7 + 2;
              pcVar6 = local_1a8;
              goto LAB_005f7c11;
            }
            puVar5 = (uint *)uv__malloc(0x28);
            if (puVar5 != (uint *)0x0) {
              puVar5[0] = 8;
              puVar5[1] = 0;
              *(uint **)&w[1].fd = puVar5;
              uVar7 = 0;
              puVar12 = local_1b0;
              uVar13 = local_190;
              goto LAB_005f7bfc;
            }
LAB_005f7d0a:
            pcVar6 = local_1a8;
            uVar13 = (ulong)uVar14;
            if (uVar14 < uVar10) {
              uVar13 = uVar10;
            }
            for (; stream = local_198, uVar13 != uVar10; uVar10 = uVar10 + 1) {
              uv__close(*(int *)((long)&pcVar6[1].cmsg_len + uVar10 * 4));
            }
            (*(code *)w[-1].watcher_queue[1])(local_198,0xfffffffffffffff4,&local_1c8);
            events = local_1b4;
            goto LAB_005f7d45;
          }
          goto LAB_005f7c34;
        }
        fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
LAB_005f7c34:
        pcVar6 = __cmsg_nxthdr((msghdr *)&msg,pcVar6);
        uVar13 = (ulong)local_1a0;
      }
    }
    (*(code *)w[-1].watcher_queue[1])(stream,lVar3,&local_1c8);
    iVar8 = local_19c;
  } while ((long)local_188 <= lVar3);
  pbVar1 = (byte *)((long)w[-1].pending_queue + 1);
  *pbVar1 = *pbVar1 | 4;
  goto LAB_005f7d45;
LAB_005f7c11:
  *puVar5 = uVar11;
  uVar10 = uVar10 + 1;
  puVar5 = puVar12;
  goto LAB_005f7b6b;
LAB_005f7c81:
  if (iVar8 == 0xb) {
    if ((*(uint *)w[-1].pending_queue >> 0xc & 1) != 0) {
      uv__io_start(*(uv_loop_t **)&w[-3].pevents,w,1);
    }
    uStack_1d0 = 0;
LAB_005f7ca7:
    (*(code *)w[-1].watcher_queue[1])(stream,uStack_1d0,&local_1c8);
  }
  else {
    *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xffff3fff;
    (*(code *)w[-1].watcher_queue[1])(stream,-(long)*piVar4,&local_1c8);
    if ((*(uint *)w[-1].pending_queue >> 0xc & 1) != 0) {
      *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xffffefff;
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,1);
      uVar11 = *(uint *)w[-1].pending_queue;
      if (((uVar11 & 4) != 0) &&
         (*(uint *)w[-1].pending_queue = uVar11 & 0xfffffffb, (uVar11 & 8) != 0)) {
        piVar4 = (int *)(*(long *)&w[-3].pevents + 8);
        *piVar4 = *piVar4 + -1;
      }
    }
  }
LAB_005f7d45:
  iVar8 = w->fd;
  if (iVar8 == -1) {
    return;
  }
LAB_005f7d4e:
  if (((events & 0x10) != 0) && (((ulong)w[-1].pending_queue[0] & 0x1c00) == 0x1400)) {
    _error = (char *)0x0;
    sStack_140 = 0;
    uv__stream_eof(stream,(uv_buf_t *)&error);
    iVar8 = w->fd;
  }
  if (((events & 0x1c) != 0) && (iVar8 != -1)) {
    uv__write(stream);
    uv__write_callbacks(stream);
    if (w + 1 == (uv__io_t *)w[1].cb) {
      uv__drain(stream);
    }
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_HANDLE_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even if it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_HANDLE_READING) &&
      (stream->flags & UV_HANDLE_READ_PARTIAL) &&
      !(stream->flags & UV_HANDLE_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (QUEUE_EMPTY(&stream->write_queue))
      uv__drain(stream);
  }
}